

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpagelayout.cpp
# Opt level: O0

void __thiscall QPageLayout::setUnits(QPageLayout *this,Unit units)

{
  long lVar1;
  QPageLayoutPrivate *pQVar2;
  Unit in_ESI;
  long in_FS_OFFSET;
  QSizeF QVar3;
  QExplicitlySharedDataPointer<QPageLayoutPrivate> *in_stack_ffffffffffffff50;
  qreal local_78;
  qreal local_70;
  qreal local_68;
  Unit in_stack_ffffffffffffffa0;
  Unit in_stack_ffffffffffffffa4;
  QMarginsF *in_stack_ffffffffffffffa8;
  qreal local_50;
  qreal local_48;
  qreal local_40;
  qreal local_38;
  qreal local_30;
  qreal local_28;
  qreal local_20;
  qreal local_18;
  qreal local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = QExplicitlySharedDataPointer<QPageLayoutPrivate>::operator->
                     ((QExplicitlySharedDataPointer<QPageLayoutPrivate> *)0x544b2c);
  if (in_ESI != pQVar2->m_units) {
    QExplicitlySharedDataPointer<QPageLayoutPrivate>::detach(in_stack_ffffffffffffff50);
    QExplicitlySharedDataPointer<QPageLayoutPrivate>::operator->
              ((QExplicitlySharedDataPointer<QPageLayoutPrivate> *)0x544b50);
    QExplicitlySharedDataPointer<QPageLayoutPrivate>::operator->
              ((QExplicitlySharedDataPointer<QPageLayoutPrivate> *)0x544b62);
    qt_convertMargins(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
    ;
    pQVar2 = QExplicitlySharedDataPointer<QPageLayoutPrivate>::operator->
                       ((QExplicitlySharedDataPointer<QPageLayoutPrivate> *)0x544b84);
    (pQVar2->m_margins).m_left = local_28;
    (pQVar2->m_margins).m_top = local_20;
    (pQVar2->m_margins).m_right = local_18;
    (pQVar2->m_margins).m_bottom = local_10;
    QExplicitlySharedDataPointer<QPageLayoutPrivate>::operator->
              ((QExplicitlySharedDataPointer<QPageLayoutPrivate> *)0x544bbe);
    QExplicitlySharedDataPointer<QPageLayoutPrivate>::operator->
              ((QExplicitlySharedDataPointer<QPageLayoutPrivate> *)0x544bd1);
    qt_convertMargins(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
    ;
    pQVar2 = QExplicitlySharedDataPointer<QPageLayoutPrivate>::operator->
                       ((QExplicitlySharedDataPointer<QPageLayoutPrivate> *)0x544bf1);
    (pQVar2->m_minMargins).m_left = local_48;
    (pQVar2->m_minMargins).m_top = local_40;
    (pQVar2->m_minMargins).m_right = local_38;
    (pQVar2->m_minMargins).m_bottom = local_30;
    QExplicitlySharedDataPointer<QPageLayoutPrivate>::operator->
              ((QExplicitlySharedDataPointer<QPageLayoutPrivate> *)0x544c25);
    QExplicitlySharedDataPointer<QPageLayoutPrivate>::operator->
              ((QExplicitlySharedDataPointer<QPageLayoutPrivate> *)0x544c38);
    qt_convertMargins(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
    ;
    pQVar2 = QExplicitlySharedDataPointer<QPageLayoutPrivate>::operator->
                       ((QExplicitlySharedDataPointer<QPageLayoutPrivate> *)0x544c58);
    (pQVar2->m_maxMargins).m_left = local_68;
    (pQVar2->m_maxMargins).m_top =
         (qreal)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0);
    (pQVar2->m_maxMargins).m_right = (qreal)in_stack_ffffffffffffffa8;
    (pQVar2->m_maxMargins).m_bottom = local_50;
    pQVar2 = QExplicitlySharedDataPointer<QPageLayoutPrivate>::operator->
                       ((QExplicitlySharedDataPointer<QPageLayoutPrivate> *)0x544c94);
    pQVar2->m_units = in_ESI;
    pQVar2 = QExplicitlySharedDataPointer<QPageLayoutPrivate>::operator->
                       ((QExplicitlySharedDataPointer<QPageLayoutPrivate> *)0x544ca5);
    QExplicitlySharedDataPointer<QPageLayoutPrivate>::operator->
              ((QExplicitlySharedDataPointer<QPageLayoutPrivate> *)0x544cb4);
    QVar3 = QPageLayoutPrivate::fullSizeUnits(pQVar2,in_ESI);
    pQVar2 = QExplicitlySharedDataPointer<QPageLayoutPrivate>::operator->
                       ((QExplicitlySharedDataPointer<QPageLayoutPrivate> *)0x544cd7);
    local_78 = QVar3.wd;
    (pQVar2->m_fullSize).wd = local_78;
    local_70 = QVar3.ht;
    (pQVar2->m_fullSize).ht = local_70;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPageLayout::setUnits(Unit units)
{
    if (units != d->m_units) {
        d.detach();
        d->m_margins = qt_convertMargins(d->m_margins, d->m_units, units);
        d->m_minMargins = qt_convertMargins(d->m_minMargins, d->m_units, units);
        d->m_maxMargins = qt_convertMargins(d->m_maxMargins, d->m_units, units);
        d->m_units = units;
        d->m_fullSize = d->fullSizeUnits(d->m_units);
    }
}